

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::ImmediateAssertionStatementSyntax::isKind(SyntaxKind kind)

{
  return (bool)(0xdU >> ((byte)(kind - ImmediateAssertStatement) & 0xf) &
               kind - ImmediateAssertStatement < 4);
}

Assistant:

bool ImmediateAssertionStatementSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ImmediateAssertStatement:
        case SyntaxKind::ImmediateAssumeStatement:
        case SyntaxKind::ImmediateCoverStatement:
            return true;
        default:
            return false;
    }
}